

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::FeatureDescriptor::FeatureDescriptor
          (FeatureDescriptor *this,string *name,string *itemFormat)

{
  string *itemFormat_local;
  string *name_local;
  FeatureDescriptor *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->Supported = true;
  std::__cxx11::string::string((string *)&this->Prefix);
  std::__cxx11::string::string((string *)&this->Suffix);
  std::__cxx11::string::string((string *)&this->ItemPathFormat,(string *)itemFormat);
  std::__cxx11::string::string((string *)&this->ItemNameFormat,(string *)&this->ItemPathFormat);
  return;
}

Assistant:

cmComputeLinkInformation::FeatureDescriptor::FeatureDescriptor(
  std::string name, std::string itemFormat)
  : Name(std::move(name))
  , Supported(true)
  , ItemPathFormat(std::move(itemFormat))
  , ItemNameFormat(this->ItemPathFormat)
{
}